

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# coded_stream.h
# Opt level: O3

bool __thiscall google::protobuf::io::CodedInputStream::Skip(CodedInputStream *this,int count)

{
  int iVar1;
  uint uVar2;
  int iVar3;
  
  if (count < 0) {
    return false;
  }
  iVar1 = *(int *)&this->buffer_end_ - (int)this->buffer_;
  if (iVar1 < count) {
    if (this->buffer_size_after_limit_ < 1) {
      uVar2 = count - iVar1;
      this->buffer_ = (uint8 *)0x0;
      this->buffer_end_ = (uint8 *)0x0;
      iVar1 = this->current_limit_;
      if (this->total_bytes_limit_ < this->current_limit_) {
        iVar1 = this->total_bytes_limit_;
      }
      iVar3 = iVar1 - this->total_bytes_read_;
      if (iVar3 < (int)uVar2) {
        if (0 < iVar3) {
          this->total_bytes_read_ = iVar1;
          (*this->input_->_vptr_ZeroCopyInputStream[4])();
        }
      }
      else {
        iVar1 = (*this->input_->_vptr_ZeroCopyInputStream[4])(this->input_,(ulong)uVar2);
        if ((char)iVar1 != '\0') {
          this->total_bytes_read_ = this->total_bytes_read_ + uVar2;
          return true;
        }
        iVar1 = (*this->input_->_vptr_ZeroCopyInputStream[5])();
        this->total_bytes_read_ = iVar1;
      }
    }
    else {
      this->buffer_ = this->buffer_ + iVar1;
    }
    return false;
  }
  this->buffer_ = this->buffer_ + (uint)count;
  return true;
}

Assistant:

inline bool CodedInputStream::Skip(int count) {
  if (count < 0) return false;  // security: count is often user-supplied

  const int original_buffer_size = BufferSize();

  if (count <= original_buffer_size) {
    // Just skipping within the current buffer.  Easy.
    Advance(count);
    return true;
  }

  return SkipFallback(count, original_buffer_size);
}